

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int newlabelentry(LexState *ls,Labellist *l,TString *name,int line,int pc)

{
  int iVar1;
  Labeldesc *block;
  int iVar2;
  
  iVar1 = l->n;
  block = l->arr;
  iVar2 = iVar1;
  if (l->size <= iVar1) {
    block = (Labeldesc *)luaM_growaux_(ls->L,block,&l->size,0x18,0x7fff,"labels/gotos");
    l->arr = block;
    iVar2 = l->n;
  }
  block[iVar1].name = name;
  block[iVar1].line = line;
  block[iVar1].nactvar = ls->fs->nactvar;
  block[iVar1].pc = pc;
  l->n = iVar2 + 1;
  return iVar1;
}

Assistant:

static int newlabelentry (LexState *ls, Labellist *l, TString *name,
                          int line, int pc) {
  int n = l->n;
  luaM_growvector(ls->L, l->arr, n, l->size,
                  Labeldesc, SHRT_MAX, "labels/gotos");
  l->arr[n].name = name;
  l->arr[n].line = line;
  l->arr[n].nactvar = ls->fs->nactvar;
  l->arr[n].pc = pc;
  l->n++;
  return n;
}